

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

void __thiscall icu_63::MessagePattern::MessagePattern(MessagePattern *this,UErrorCode *errorCode)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_003eca60;
  this->aposMode = UMSGPAT_APOS_DOUBLE_OPTIONAL;
  (this->msg).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f7be0;
  (this->msg).fUnion.fStackFields.fLengthAndFlags = 2;
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  *(undefined8 *)((long)&this->numericValues + 7) = 0;
  init(this,(EVP_PKEY_CTX *)errorCode);
  return;
}

Assistant:

MessagePattern::MessagePattern(UErrorCode &errorCode)
        : aposMode(UCONFIG_MSGPAT_DEFAULT_APOSTROPHE_MODE),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(FALSE), hasArgNumbers(FALSE), needsAutoQuoting(FALSE) {
    init(errorCode);
}